

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bbox.cpp
# Opt level: O3

BBox<3> * Omega_h::find_bounding_box<3>(BBox<3> *__return_storage_ptr__,Reals *coords)

{
  int *piVar1;
  Int i;
  int iVar2;
  ulong uVar3;
  long lVar4;
  Alloc *this;
  bool bVar5;
  BBox<3> init;
  Alloc *local_70;
  undefined8 local_50 [6];
  
  this = (coords->write_).shared_alloc_.alloc;
  if (((ulong)this & 1) == 0) {
    uVar3 = this->size;
  }
  else {
    uVar3 = (ulong)this >> 3;
  }
  iVar2 = (int)(uVar3 >> 3);
  if (iVar2 * -0x55555555 + 0x2aaaaaaaU < 0x55555555) {
    lVar4 = 0;
    do {
      local_50[lVar4] = 0x7fefffffffffffff;
      local_50[lVar4 + 3] = 0xffefffffffffffff;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    if (((ulong)this & 7) == 0 && this != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        this = (Alloc *)(this->size * 8 + 1);
      }
      else {
        this->use_count = this->use_count + 1;
      }
    }
    bVar5 = ((ulong)this & 7) == 0;
    local_70 = this;
    if (bVar5 && this != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_70 = (Alloc *)(this->size * 8 + 1);
      }
      else {
        this->use_count = this->use_count + 1;
      }
    }
    transform_reduce<Omega_h::IntIterator,Omega_h::GetBBoxOp<3>,Omega_h::BBox<3>,Omega_h::UniteOp<3>>
              (__return_storage_ptr__,(Omega_h *)0x0,iVar2 / 3);
    if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
      piVar1 = &local_70->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_70);
        operator_delete(local_70,0x48);
      }
    }
    if (bVar5 && this != (Alloc *)0x0) {
      piVar1 = &this->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(this);
        operator_delete(this,0x48);
      }
    }
    return __return_storage_ptr__;
  }
  fail("assertion %s failed at %s +%d\n","a % b == 0",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
       ,0x11a);
}

Assistant:

BBox<dim> find_bounding_box(Reals coords) {
  auto npts = divide_no_remainder(coords.size(), dim);
  BBox<dim> init;
  for (Int i = 0; i < dim; ++i) {
    init.min[i] = ArithTraits<Real>::max();
    init.max[i] = ArithTraits<Real>::min();
  }
  return transform_reduce(IntIterator(0), IntIterator(npts), init,
      UniteOp<dim>(), GetBBoxOp<dim>(coords));
}